

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_local_time_only<toml::type_config>
            (result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  uint uVar1;
  size_type sVar2;
  uint *puVar3;
  tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region> *extraout_RDX;
  tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region> *extraout_RDX_00;
  tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region> *v;
  tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region> *v_00;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  region *this;
  allocator<char> local_e69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> secfrac;
  undefined1 local_e28 [104];
  string str;
  source_location src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10;
  result<int,_toml::detail::none_t> ns_r;
  result<int,_toml::detail::none_t> us_r;
  result<int,_toml::detail::none_t> ms_r;
  result<int,_toml::detail::none_t> sec_r;
  result<int,_toml::detail::none_t> minute_r;
  result<int,_toml::detail::none_t> hour_r;
  location first;
  string local_c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  string local_c30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c10;
  string local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  string local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  region reg;
  location local_988;
  location local_940;
  source_location local_8f8;
  source_location local_880;
  source_location local_808;
  source_location local_790;
  source_location local_718;
  source_location local_6a0;
  source_location local_628;
  source_location local_5b0;
  error_info local_538;
  error_info local_4e0;
  error_info local_488;
  error_info local_430;
  error_info local_3d8;
  error_info local_380;
  error_info local_328;
  error_info local_2d0;
  error_info local_278;
  error_info local_220;
  region local_1c8;
  region local_140;
  region local_b8;
  
  location::location(&first,loc);
  syntax::local_time((sequence *)&src,&ctx->toml_spec_);
  sequence::scan(&reg,(sequence *)&src,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &src.first_line_);
  if (reg.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    if ((ctx->toml_spec_).v1_1_0_make_seconds_optional == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a10,
                 "toml::parse_local_time: invalid time: time must be HH:MM(:SS.sss) (seconds are optional)"
                 ,(allocator<char> *)&str);
      syntax::local_time((sequence *)local_e28,&ctx->toml_spec_);
      location::location(&local_940,loc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a30,"",(allocator<char> *)&secfrac);
      make_syntax_error<toml::detail::sequence>
                ((error_info *)&src,&local_a10,(sequence *)local_e28,&local_940,&local_a30);
      err<toml::error_info>((failure<toml::error_info> *)&local_220,(error_info *)&src);
      result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
      ::result(__return_storage_ptr__,(failure_type *)&local_220);
      error_info::~error_info(&local_220);
      error_info::~error_info((error_info *)&src);
      std::__cxx11::string::~string((string *)&local_a30);
      location::~location(&local_940);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_e28 + 8));
      psVar4 = &local_a10;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a50,
                 "toml::parse_local_time: invalid time: time must be HH:MM:SS(.sss) (subseconds are optional)"
                 ,(allocator<char> *)&str);
      syntax::local_time((sequence *)local_e28,&ctx->toml_spec_);
      location::location(&local_988,loc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a70,"",(allocator<char> *)&secfrac);
      make_syntax_error<toml::detail::sequence>
                ((error_info *)&src,&local_a50,(sequence *)local_e28,&local_988,&local_a70);
      err<toml::error_info>((failure<toml::error_info> *)&local_278,(error_info *)&src);
      result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
      ::result(__return_storage_ptr__,(failure_type *)&local_278);
      error_info::~error_info(&local_278);
      error_info::~error_info((error_info *)&src);
      std::__cxx11::string::~string((string *)&local_a70);
      location::~location(&local_988);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_e28 + 8));
      psVar4 = &local_a50;
    }
    goto LAB_0033b1c4;
  }
  region::as_string_abi_cxx11_(&str,&reg);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,0,2);
  from_string<int>((detail *)&hour_r,(string *)&src);
  std::__cxx11::string::~string((string *)&src);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,3,2);
  from_string<int>((detail *)&minute_r,(string *)&src);
  std::__cxx11::string::~string((string *)&src);
  if (hour_r.is_ok_ == false) {
    region::region((region *)local_e28,&first);
    source_location::source_location(&src,(region *)local_e28);
    region::~region((region *)local_e28);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_e68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
               0,2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secfrac,
                   "toml::parse_local_time: failed to read hour `",&local_e68);
    std::operator+(&local_a90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secfrac,"`"
                  );
    source_location::source_location(&local_5b0,&src);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ab0,"here",(allocator<char> *)&local_d10);
    make_error_info<>((error_info *)local_e28,(string *)&local_a90,&local_5b0,&local_ab0);
    err<toml::error_info>((failure<toml::error_info> *)&local_2d0,(error_info *)local_e28);
    result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
    ::result(__return_storage_ptr__,(failure_type *)&local_2d0);
    error_info::~error_info(&local_2d0);
    error_info::~error_info((error_info *)local_e28);
    std::__cxx11::string::~string((string *)&local_ab0);
    source_location::~source_location(&local_5b0);
    pbVar5 = &local_a90;
LAB_0033b196:
    std::__cxx11::string::~string((string *)pbVar5);
    std::__cxx11::string::~string((string *)&secfrac);
    psVar4 = (string *)&local_e68;
LAB_0033b1aa:
    std::__cxx11::string::~string((string *)psVar4);
    source_location::~source_location(&src);
  }
  else {
    if (minute_r.is_ok_ == false) {
      region::region((region *)local_e28,&first);
      source_location::source_location(&src,(region *)local_e28);
      region::~region((region *)local_e28);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_e68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,3,2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secfrac,
                     "toml::parse_local_time: failed to read minute `",&local_e68);
      std::operator+(&local_ad0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secfrac,
                     "`");
      source_location::source_location(&local_628,&src);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_af0,"here",(allocator<char> *)&local_d10);
      make_error_info<>((error_info *)local_e28,(string *)&local_ad0,&local_628,&local_af0);
      err<toml::error_info>((failure<toml::error_info> *)&local_328,(error_info *)local_e28);
      result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
      ::result(__return_storage_ptr__,(failure_type *)&local_328);
      error_info::~error_info(&local_328);
      error_info::~error_info((error_info *)local_e28);
      std::__cxx11::string::~string((string *)&local_af0);
      source_location::~source_location(&local_628);
      pbVar5 = &local_ad0;
      goto LAB_0033b196;
    }
    puVar3 = (uint *)result<int,_toml::detail::none_t>::unwrap(&hour_r,(source_location)0x4db2c8);
    uVar1 = *puVar3;
    puVar3 = (uint *)result<int,_toml::detail::none_t>::unwrap(&minute_r,(source_location)0x4db2e0);
    if (0x3b < *puVar3 || 0x17 < uVar1) {
      region::region((region *)local_e28,&first);
      source_location::source_location(&src,(region *)local_e28);
      region::~region((region *)local_e28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b10,"toml::parse_local_time: invalid time.",
                 (allocator<char> *)&secfrac);
      source_location::source_location(&local_6a0,&src);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b30,"hour must be 00-23, minute must be 00-59.",
                 (allocator<char> *)&local_e68);
      make_error_info<>((error_info *)local_e28,&local_b10,&local_6a0,&local_b30);
      err<toml::error_info>((failure<toml::error_info> *)&local_380,(error_info *)local_e28);
      result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
      ::result(__return_storage_ptr__,(failure_type *)&local_380);
      error_info::~error_info(&local_380);
      error_info::~error_info((error_info *)local_e28);
      std::__cxx11::string::~string((string *)&local_b30);
      source_location::~source_location(&local_6a0);
      psVar4 = &local_b10;
      goto LAB_0033b1aa;
    }
    if ((str._M_string_length == 5) && ((ctx->toml_spec_).v1_1_0_make_seconds_optional == true)) {
      region::region((region *)&src,&reg);
      src.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      this = &local_b8;
      v = extraout_RDX;
LAB_0033b525:
      src.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ok<std::tuple<toml::local_time,toml::local_time_format_info,toml::detail::region>>
                ((success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
                  *)this,(toml *)&src,v);
      result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
      ::result(__return_storage_ptr__,(success_type *)this);
      region::~region(this);
      region::~region((region *)&src);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,6,2);
      from_string<int>((detail *)&sec_r,(string *)&src);
      std::__cxx11::string::~string((string *)&src);
      if (sec_r.is_ok_ == false) {
        region::region((region *)local_e28,&first);
        source_location::source_location(&src,(region *)local_e28);
        region::~region((region *)local_e28);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_e68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,6,2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secfrac
                       ,"toml::parse_local_time: failed to read second `",&local_e68);
        std::operator+(&local_b50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secfrac
                       ,"`");
        source_location::source_location(&local_718,&src);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b70,"here",(allocator<char> *)&local_d10);
        make_error_info<>((error_info *)local_e28,(string *)&local_b50,&local_718,&local_b70);
        err<toml::error_info>((failure<toml::error_info> *)&local_3d8,(error_info *)local_e28);
        result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
        ::result(__return_storage_ptr__,(failure_type *)&local_3d8);
        error_info::~error_info(&local_3d8);
        error_info::~error_info((error_info *)local_e28);
        std::__cxx11::string::~string((string *)&local_b70);
        source_location::~source_location(&local_718);
        pbVar5 = &local_b50;
        goto LAB_0033b196;
      }
      puVar3 = (uint *)result<int,_toml::detail::none_t>::unwrap(&sec_r,(source_location)0x4db2f8);
      if (0x3c < *puVar3) {
        region::region((region *)local_e28,&first);
        source_location::source_location(&src,(region *)local_e28);
        region::~region((region *)local_e28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b90,"toml::parse_local_time: invalid time.",
                   (allocator<char> *)&secfrac);
        source_location::source_location(&local_790,&src);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_bb0,"second must be 00-60.",(allocator<char> *)&local_e68);
        make_error_info<>((error_info *)local_e28,&local_b90,&local_790,&local_bb0);
        err<toml::error_info>((failure<toml::error_info> *)&local_430,(error_info *)local_e28);
        result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
        ::result(__return_storage_ptr__,(failure_type *)&local_430);
        error_info::~error_info(&local_430);
        error_info::~error_info((error_info *)local_e28);
        std::__cxx11::string::~string((string *)&local_bb0);
        source_location::~source_location(&local_790);
        psVar4 = &local_b90;
        goto LAB_0033b1aa;
      }
      if (str._M_string_length == 8) {
        region::region((region *)&src,&reg);
        src.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 1;
        this = &local_140;
        v = extraout_RDX_00;
        goto LAB_0033b525;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secfrac,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,9,
                 str._M_string_length - 9);
      sVar2 = secfrac._M_string_length;
      while (secfrac._M_string_length < 9) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secfrac,'0')
        ;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secfrac,0,3);
      from_string<int>((detail *)&ms_r,(string *)&src);
      std::__cxx11::string::~string((string *)&src);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secfrac,3,3);
      from_string<int>((detail *)&us_r,(string *)&src);
      std::__cxx11::string::~string((string *)&src);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secfrac,6,3);
      from_string<int>((detail *)&ns_r,(string *)&src);
      std::__cxx11::string::~string((string *)&src);
      if (ms_r.is_ok_ == false) {
        region::region((region *)local_e28,&first);
        source_location::source_location(&src,(region *)local_e28);
        region::~region((region *)local_e28);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_d10,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secfrac,0,3
                  );
        std::operator+(&local_e68,"toml::parse_local_time: failed to read milliseconds `",&local_d10
                      );
        std::operator+(&local_bd0,&local_e68,"`");
        source_location::source_location(&local_808,&src);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_bf0,"here",&local_e69);
        make_error_info<>((error_info *)local_e28,(string *)&local_bd0,&local_808,&local_bf0);
        err<toml::error_info>((failure<toml::error_info> *)&local_488,(error_info *)local_e28);
        result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
        ::result(__return_storage_ptr__,(failure_type *)&local_488);
        error_info::~error_info(&local_488);
        error_info::~error_info((error_info *)local_e28);
        std::__cxx11::string::~string((string *)&local_bf0);
        source_location::~source_location(&local_808);
        pbVar5 = &local_bd0;
LAB_0033baaa:
        std::__cxx11::string::~string((string *)pbVar5);
        std::__cxx11::string::~string((string *)&local_e68);
        std::__cxx11::string::~string((string *)&local_d10);
        source_location::~source_location(&src);
      }
      else {
        if (us_r.is_ok_ == false) {
          region::region((region *)local_e28,&first);
          source_location::source_location(&src,(region *)local_e28);
          region::~region((region *)local_e28);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_d10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,3,3);
          std::operator+(&local_e68,"toml::parse_local_time: failed to read microseconds`",
                         &local_d10);
          std::operator+(&local_c10,&local_e68,"`");
          source_location::source_location(&local_880,&src);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c30,"here",&local_e69)
          ;
          make_error_info<>((error_info *)local_e28,(string *)&local_c10,&local_880,&local_c30);
          err<toml::error_info>((failure<toml::error_info> *)&local_4e0,(error_info *)local_e28);
          result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
          ::result(__return_storage_ptr__,(failure_type *)&local_4e0);
          error_info::~error_info(&local_4e0);
          error_info::~error_info((error_info *)local_e28);
          std::__cxx11::string::~string((string *)&local_c30);
          source_location::~source_location(&local_880);
          pbVar5 = &local_c10;
          goto LAB_0033baaa;
        }
        if (ns_r.is_ok_ == false) {
          region::region((region *)local_e28,&first);
          source_location::source_location(&src,(region *)local_e28);
          region::~region((region *)local_e28);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_d10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,6,3);
          std::operator+(&local_e68,"toml::parse_local_time: failed to read nanoseconds`",&local_d10
                        );
          std::operator+(&local_c50,&local_e68,"`");
          source_location::source_location(&local_8f8,&src);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c70,"here",&local_e69)
          ;
          make_error_info<>((error_info *)local_e28,(string *)&local_c50,&local_8f8,&local_c70);
          err<toml::error_info>((failure<toml::error_info> *)&local_538,(error_info *)local_e28);
          result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
          ::result(__return_storage_ptr__,(failure_type *)&local_538);
          error_info::~error_info(&local_538);
          error_info::~error_info((error_info *)local_e28);
          std::__cxx11::string::~string((string *)&local_c70);
          source_location::~source_location(&local_8f8);
          pbVar5 = &local_c50;
          goto LAB_0033baaa;
        }
        result<int,_toml::detail::none_t>::unwrap(&ms_r,(source_location)0x4db310);
        result<int,_toml::detail::none_t>::unwrap(&us_r,(source_location)0x4db328);
        result<int,_toml::detail::none_t>::unwrap(&ns_r,(source_location)0x4db340);
        region::region((region *)&src,&reg);
        src.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 1;
        src.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sVar2;
        ok<std::tuple<toml::local_time,toml::local_time_format_info,toml::detail::region>>
                  ((success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
                    *)&local_1c8,(toml *)&src,v_00);
        result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
        ::result(__return_storage_ptr__,(success_type *)&local_1c8);
        region::~region(&local_1c8);
        region::~region((region *)&src);
      }
      std::__cxx11::string::~string((string *)&secfrac);
    }
  }
  psVar4 = &str;
LAB_0033b1c4:
  std::__cxx11::string::~string((string *)psVar4);
  region::~region(&reg);
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<std::tuple<local_time, local_time_format_info, region>, error_info>
parse_local_time_only(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    local_time_format_info fmt;

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::local_time(spec).scan(loc);
    if( ! reg.is_ok())
    {
        if(spec.v1_1_0_make_seconds_optional)
        {
            return err(make_syntax_error("toml::parse_local_time: "
                "invalid time: time must be HH:MM(:SS.sss) (seconds are optional)",
                syntax::local_time(spec), loc));
        }
        else
        {
            return err(make_syntax_error("toml::parse_local_time: "
                "invalid time: time must be HH:MM:SS(.sss) (subseconds are optional)",
                syntax::local_time(spec), loc));
        }
    }

    // ----------------------------------------------------------------------
    // it matches. gen value
    const auto str = reg.as_string();

    // at least we have HH:MM.
    // 01234
    // HH:MM
    const auto hour_r   = from_string<int>(str.substr(0, 2));
    const auto minute_r = from_string<int>(str.substr(3, 2));

    if(hour_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read hour `" + str.substr(0, 2) + "`",
            std::move(src), "here"));
    }
    if(minute_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read minute `" + str.substr(3, 2) + "`",
            std::move(src), "here"));
    }

    const auto hour   = hour_r.unwrap();
    const auto minute = minute_r.unwrap();

    if((hour < 0 || 24 <= hour) || (minute < 0 || 60 <= minute))
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: invalid time.",
            std::move(src), "hour must be 00-23, minute must be 00-59."));
    }

    // -----------------------------------------------------------------------
    // we have hour and minute.
    // Since toml v1.1.0, second and subsecond part becomes optional.
    // Check the version and return if second does not exist.

    if(str.size() == 5 && spec.v1_1_0_make_seconds_optional)
    {
        fmt.has_seconds = false;
        fmt.subsecond_precision = 0;
        return ok(std::make_tuple(local_time(hour, minute, 0), std::move(fmt), std::move(reg)));
    }
    assert(str.at(5) == ':');

    // we have at least `:SS` part. `.subseconds` are optional.

    // 0         1
    // 012345678901234
    // HH:MM:SS.subsec
    const auto sec_r = from_string<int>(str.substr(6, 2));
    if(sec_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read second `" + str.substr(6, 2) + "`",
            std::move(src), "here"));
    }
    const auto sec = sec_r.unwrap();

    if(sec < 0 || 60 < sec) // :60 is allowed
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: invalid time.",
                    std::move(src), "second must be 00-60."));
    }

    if(str.size() == 8)
    {
        fmt.has_seconds = true;
        fmt.subsecond_precision = 0;
        return ok(std::make_tuple(local_time(hour, minute, sec), std::move(fmt), std::move(reg)));
    }

    assert(str.at(8) == '.');

    auto secfrac = str.substr(9, str.size() - 9);

    fmt.has_seconds = true;
    fmt.subsecond_precision = secfrac.size();

    while(secfrac.size() < 9)
    {
        secfrac += '0';
    }
    assert(9 <= secfrac.size());
    const auto ms_r = from_string<int>(secfrac.substr(0, 3));
    const auto us_r = from_string<int>(secfrac.substr(3, 3));
    const auto ns_r = from_string<int>(secfrac.substr(6, 3));

    if(ms_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read milliseconds `" + secfrac.substr(0, 3) + "`",
            std::move(src), "here"));
    }
    if(us_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read microseconds`" + str.substr(3, 3) + "`",
            std::move(src), "here"));
    }
    if(ns_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read nanoseconds`" + str.substr(6, 3) + "`",
            std::move(src), "here"));
    }
    const auto ms = ms_r.unwrap();
    const auto us = us_r.unwrap();
    const auto ns = ns_r.unwrap();

    return ok(std::make_tuple(local_time(hour, minute, sec, ms, us, ns), std::move(fmt), std::move(reg)));
}